

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

QModelIndex * __thiscall QListView::indexAt(QListView *this,QPoint *p)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  qsizetype qVar4;
  QModelIndex *pQVar5;
  bool in_DL;
  QRect *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QListViewPrivate *d;
  QModelIndex index;
  QList<QModelIndex> intersectVector;
  QRect rect;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  QModelIndex *this_00;
  undefined1 doLayout;
  undefined4 in_stack_ffffffffffffff80;
  undefined1 local_58 [16];
  undefined1 *local_48;
  undefined1 *local_40;
  QAbstractItemModel *local_38;
  QList<QModelIndex> local_30;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  d_func((QListView *)0x87b0ef);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  iVar3 = QPoint::x((QPoint *)0x87b11c);
  doLayout = (undefined1)((uint)iVar3 >> 0x18);
  (**(code **)(*(long *)in_RSI + 0x2b0))();
  iVar3 = QPoint::y((QPoint *)0x87b144);
  (**(code **)(*(long *)in_RSI + 0x2b8))();
  QRect::QRect((QRect *)this_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffff5c,
               in_stack_ffffffffffffff58);
  local_30.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_30.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_30.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QListViewPrivate::intersectingSet
            ((QListViewPrivate *)CONCAT44(iVar3,in_stack_ffffffffffffff80),in_RSI,(bool)doLayout);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  qVar4 = QList<QModelIndex>::size(&local_30);
  if (qVar4 < 1) {
    QModelIndex::QModelIndex((QModelIndex *)0x87b220);
  }
  else {
    pQVar5 = QList<QModelIndex>::last
                       ((QList<QModelIndex> *)
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    local_48 = *(undefined1 **)pQVar5;
    local_40 = (undefined1 *)pQVar5->i;
    local_38 = (pQVar5->m).ptr;
  }
  bVar1 = QModelIndex::isValid(in_RDI);
  bVar2 = 0;
  if (bVar1) {
    local_58 = (**(code **)(*(long *)in_RSI + 0x1e0))(in_RSI,&local_48);
    bVar2 = QRect::contains((QPoint *)local_58,in_DL);
  }
  if ((bVar2 & 1) == 0) {
    QModelIndex::QModelIndex((QModelIndex *)0x87b2a8);
  }
  else {
    *(undefined1 **)in_RDI = local_48;
    in_RDI->i = (quintptr)local_40;
    (in_RDI->m).ptr = local_38;
  }
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0x87b2ba);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QModelIndex QListView::indexAt(const QPoint &p) const
{
    Q_D(const QListView);
    QRect rect(p.x() + horizontalOffset(), p.y() + verticalOffset(), 1, 1);
    const QList<QModelIndex> intersectVector = d->intersectingSet(rect);
    QModelIndex index = intersectVector.size() > 0
                        ? intersectVector.last() : QModelIndex();
    if (index.isValid() && visualRect(index).contains(p))
        return index;
    return QModelIndex();
}